

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_posix_file_storage.cpp
# Opt level: O2

void __thiscall cppcms::sessions::session_file_storage::gc(session_file_storage *this)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  dirent *__entry;
  DIR *__dirp;
  int *piVar4;
  cppcms_error *this_00;
  ulong uVar5;
  dirent *entry_p;
  locked_file file;
  char *local_90 [4];
  string local_70;
  string sid;
  
  lVar3 = pathconf((this->path_)._M_dataplus._M_p,3);
  uVar5 = 0x218;
  if (-1 < (int)lVar3) {
    uVar5 = (long)(int)lVar3 + 0x119;
  }
  __entry = (dirent *)operator_new__(uVar5);
  __dirp = opendir((this->path_)._M_dataplus._M_p);
  if (__dirp == (DIR *)0x0) {
    piVar4 = __errno_location();
    iVar2 = *piVar4;
    this_00 = (cppcms_error *)__cxa_allocate_exception(0x30);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&file,
                   "Failed to open directory :",&this->path_);
    cppcms_error::cppcms_error(this_00,iVar2,(string *)&file);
    __cxa_throw(this_00,&cppcms_error::typeinfo,booster::runtime_error::~runtime_error);
  }
  do {
    iVar2 = readdir_r(__dirp,__entry,(dirent **)&entry_p);
    if ((iVar2 != 0) || (entry_p == (dirent *)0x0)) {
      closedir(__dirp);
      operator_delete__(__entry);
      return;
    }
    lVar3 = 0;
    do {
      if (lVar3 == 0x20) {
        if (__entry->d_name[0x20] == '\0') {
          std::__cxx11::string::string((string *)&sid,__entry->d_name,(allocator *)&file);
          std::__cxx11::string::string((string *)&local_70,(string *)&sid);
          locked_file::locked_file(&file,this,&local_70,false);
          std::__cxx11::string::~string((string *)&local_70);
          if ((-1 < file.fd_) && (bVar1 = read_timestamp(this,file.fd_), !bVar1)) {
            std::__cxx11::string::string((string *)local_90,(string *)&file.name_);
            unlink(local_90[0]);
            std::__cxx11::string::~string((string *)local_90);
          }
          locked_file::~locked_file(&file);
          std::__cxx11::string::~string((string *)&sid);
        }
        break;
      }
      iVar2 = isxdigit((int)__entry->d_name[lVar3]);
      lVar3 = lVar3 + 1;
    } while (iVar2 != 0);
  } while( true );
}

Assistant:

void session_file_storage::gc()
{
	DIR *d=0;
	struct dirent *entry_st=0,*entry_p;
	int path_len=pathconf(path_.c_str(),_PC_NAME_MAX);
	if(path_len < 0 ) { 
		// Only "sessions" should be in this directory
		// also this directory has high level of trust
		// thus... Don't care about symlink exploits
		#ifdef NAME_MAX
		path_len=NAME_MAX;
		#elif defined(PATH_MAX)
		path_len=PATH_MAX;
		#else
		path_len=4096; // guess
		#endif
	}
	// this is for Solaris... 
	entry_st=(struct dirent *)new char[sizeof(struct dirent)+path_len+1];
	try{
		if((d=::opendir(path_.c_str()))==NULL) {
			int err=errno;
			throw cppcms_error(err,"Failed to open directory :"+path_);
		}
		while(::readdir_r(d,entry_st,&entry_p)==0 && entry_p!=NULL) {
			int i;
			for(i=0;i<32;i++) {
				if(!isxdigit(entry_st->d_name[i]))
					break;
			}
			if(i!=32 || entry_st->d_name[i]!=0) 
				continue;
			std::string sid=entry_st->d_name;
			{
				locked_file file(this,sid,false);
				if(file.fd() >=0 && !read_timestamp(file.fd()))
					::unlink(file.name().c_str());
			}
		}
		::closedir(d);
	}
	catch(...) {
		if(d) ::closedir(d);
		delete [] entry_st;
		throw;
	}
	delete [] entry_st;
}